

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

Spectrum __thiscall
pbrt::ParameterDictionary::GetOneSpectrum
          (ParameterDictionary *this,string *name,Spectrum *defaultValue,SpectrumType spectrumType,
          Allocator alloc)

{
  bool bVar1;
  const_iterator ppPVar2;
  size_type sVar3;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RCX;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RSI;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> s;
  ParsedParameter *p;
  const_iterator __end1;
  const_iterator __begin1;
  ParsedParameterVector *__range1;
  SpectrumType in_stack_00000204;
  ParsedParameter *in_stack_00000208;
  ParameterDictionary *in_stack_00000210;
  Allocator in_stack_00000218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  pointer in_stack_ffffffffffffff98;
  FileLoc *in_stack_ffffffffffffffa0;
  const_iterator local_40;
  
  local_40 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             ::begin(in_RSI);
  ppPVar2 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
            ::end(in_RCX);
  do {
    if (local_40 == ppPVar2) {
      Spectrum::Spectrum((Spectrum *)in_RCX,(Spectrum *)in_stack_ffffffffffffff58);
      return (Spectrum)
             (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
              )in_RDI.bits;
    }
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RCX,in_stack_ffffffffffffff58);
    if (!bVar1) {
      args = in_R9;
      extractSpectrumArray(in_stack_00000210,in_stack_00000208,in_stack_00000204,in_stack_00000218);
      bVar1 = std::vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_>::empty
                        ((vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> *)in_RDI.bits);
      if (bVar1) {
        bVar1 = false;
      }
      else {
        sVar3 = std::vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_>::size
                          ((vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> *)
                           &stack0xffffffffffffff98);
        if (1 < sVar3) {
          ErrorExit<std::__cxx11::string_const&>
                    (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,args);
        }
        std::vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_>::operator[]
                  ((vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> *)
                   &stack0xffffffffffffff98,0);
        Spectrum::Spectrum((Spectrum *)in_RCX,(Spectrum *)in_stack_ffffffffffffff58);
        bVar1 = true;
      }
      std::vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_>::~vector
                ((vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> *)in_RDI.bits);
      if (bVar1) {
        return (Spectrum)
               (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                )in_RDI.bits;
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

Spectrum ParameterDictionary::GetOneSpectrum(const std::string &name,
                                             Spectrum defaultValue,
                                             SpectrumType spectrumType,
                                             Allocator alloc) const {
    for (const ParsedParameter *p : params) {
        if (p->name != name)
            continue;

        std::vector<Spectrum> s = extractSpectrumArray(*p, spectrumType, alloc);
        if (!s.empty()) {
            if (s.size() > 1)
                ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                          name);
            return s[0];
        }
    }

    return defaultValue;
}